

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::Json_BorderAgentEncodingDecoding_Test::TestBody
          (Json_BorderAgentEncodingDecoding_Test *this)

{
  size_type sVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *expected_predicate_value;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  State local_3f4;
  json json;
  UnixTime local_3e0;
  ByteArray local_3d8;
  ByteArray local_3b8;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  BorderAgent new_val;
  BorderAgent ba_orig;
  
  json.m_type = null;
  json.m_value.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&json);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&json);
  BorderAgent::BorderAgent(&new_val);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"1.1.1.1","");
  local_3b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,anon_var_dwarf_66ec33 + 9);
  BorderAgent::State::State(&local_3f4,4,2,1,0,0);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"net1","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,anon_var_dwarf_66ec33 + 9);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,anon_var_dwarf_66ec33 + 9);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,anon_var_dwarf_66ec33 + 9);
  local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,anon_var_dwarf_66ec33 + 9);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340);
  UnixTime::UnixTime(&local_3e0,0);
  expected_predicate_value = (char *)(ulong)(uint)local_3f4;
  BorderAgent::BorderAgent
            (&ba_orig,&local_478,1,&local_3b8,&local_458,local_3f4,&local_418,0x101010101010101,
             &local_438,&local_360,(Timestamp)0x0,0,&local_380,&local_3d8,&local_3a0,'\0',0,
             &local_340,local_3e0,0x3b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  if (local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if (local_3b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  BorderAgentToJson(&ba_orig,&json);
  BorderAgentFromJson(&new_val,&json);
  local_458._M_dataplus._M_p =
       (pointer)(CONCAT71(local_458._M_dataplus._M_p._1_7_,(byte)new_val.mPresentFlags) &
                0xffffffffffffff01);
  local_458._M_string_length = 0;
  if (((byte)new_val.mPresentFlags & 1) == 0) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kAddrBit) != 0","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x7d,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  local_458._M_dataplus._M_p =
       (pointer)(CONCAT71(local_458._M_dataplus._M_p._1_7_,(byte)new_val.mPresentFlags >> 1) &
                0xffffffffffffff01);
  local_458._M_string_length = 0;
  if (((byte)new_val.mPresentFlags >> 1 & 1) == 0) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kPortBit) != 0","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x7e,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  local_458._M_dataplus._M_p =
       (pointer)(CONCAT71(local_458._M_dataplus._M_p._1_7_,(byte)new_val.mPresentFlags >> 4) &
                0xffffffffffffff01);
  local_458._M_string_length = 0;
  if (((byte)new_val.mPresentFlags >> 4 & 1) == 0) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kNetworkNameBit) != 0",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x7f,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  local_458._M_dataplus._M_p =
       (pointer)(CONCAT71(local_458._M_dataplus._M_p._1_7_,(byte)new_val.mPresentFlags >> 5) &
                0xffffffffffffff01);
  local_458._M_string_length = 0;
  if (((byte)new_val.mPresentFlags >> 5 & 1) == 0) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x80,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  local_458._M_dataplus._M_p._0_1_ = (byte)new_val.mPresentFlags >> 3 & 1;
  local_458._M_string_length = 0;
  if (((byte)new_val.mPresentFlags >> 3 & 1) == 0) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"(new_val.mPresentFlags & BorderAgent::kStateBit) != 0","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x81,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  if (new_val.mAddr._M_string_length == ba_orig.mAddr._M_string_length) {
    if (new_val.mAddr._M_string_length != 0) {
      iVar2 = bcmp(new_val.mAddr._M_dataplus._M_p,ba_orig.mAddr._M_dataplus._M_p,
                   new_val.mAddr._M_string_length);
      local_458._M_dataplus._M_p._0_1_ = iVar2 == 0;
      if (!(bool)(byte)local_458._M_dataplus._M_p) goto LAB_0012816e;
    }
  }
  else {
    local_458._M_dataplus._M_p._0_1_ = false;
LAB_0012816e:
    local_458._M_string_length = 0;
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,(AssertionResult *)"new_val.mAddr == ba_orig.mAddr"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x82,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  local_458._M_dataplus._M_p._0_1_ = new_val.mPort == ba_orig.mPort;
  local_458._M_string_length = 0;
  if (!(bool)(byte)local_458._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,(AssertionResult *)"new_val.mPort == ba_orig.mPort"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x83,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  if (new_val.mNetworkName._M_string_length == ba_orig.mNetworkName._M_string_length) {
    if (new_val.mNetworkName._M_string_length == 0) goto LAB_001283e5;
    iVar2 = bcmp(new_val.mNetworkName._M_dataplus._M_p,ba_orig.mNetworkName._M_dataplus._M_p,
                 new_val.mNetworkName._M_string_length);
    local_458._M_dataplus._M_p._0_1_ = iVar2 == 0;
    local_458._M_string_length = 0;
    if ((bool)(byte)local_458._M_dataplus._M_p) goto LAB_001283e5;
  }
  else {
    local_458._M_dataplus._M_p._0_1_ = false;
  }
  local_458._M_string_length = 0;
  testing::Message::Message((Message *)&local_418);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_478,(internal *)&local_458,
             (AssertionResult *)"new_val.mNetworkName == ba_orig.mNetworkName","false","true",
             expected_predicate_value);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_438,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
             ,0x84,local_478._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
  }
  sVar1 = local_458._M_string_length;
  if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_458._M_string_length !=
        (undefined8 *)(local_458._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_458._M_string_length);
    }
    operator_delete((void *)sVar1);
  }
LAB_001283e5:
  uVar3 = BorderAgent::State::operator_cast_to_unsigned_int(&new_val.mState);
  uVar4 = BorderAgent::State::operator_cast_to_unsigned_int(&ba_orig.mState);
  local_458._M_dataplus._M_p._0_1_ = uVar3 == uVar4;
  local_458._M_string_length = 0;
  if (!(bool)(byte)local_458._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"new_val.mState == ba_orig.mState","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x85,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  local_458._M_dataplus._M_p._0_1_ = new_val.mExtendedPanId == ba_orig.mExtendedPanId;
  local_458._M_string_length = 0;
  if (new_val.mExtendedPanId != ba_orig.mExtendedPanId) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_458,
               (AssertionResult *)"new_val.mExtendedPanId == ba_orig.mExtendedPanId","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x86,local_478._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 8))();
    }
    sVar1 = local_458._M_string_length;
    if ((undefined8 *)local_458._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_458._M_string_length !=
          (undefined8 *)(local_458._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_458._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
  }
  BorderAgent::~BorderAgent(&ba_orig);
  BorderAgent::~BorderAgent(&new_val);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&json);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&json.m_value.boolean,json.m_type);
  return;
}

Assistant:

TEST(Json, BorderAgentEncodingDecoding)
{
    nlohmann::json json;
    BorderAgent    new_val;
    BorderAgent    ba_orig{"1.1.1.1",
                        1,
                        ByteArray{},
                        "",
                        BorderAgent::State{BorderAgent::State::ConnectionMode::kX509Connection,
                                           BorderAgent::State::ThreadInterfaceStatus::kActive,
                                           BorderAgent::State::Availability::kHigh, 0, 0},
                        "net1",
                        0x0101010101010101,
                        "",
                        "",
                        Timestamp{},
                        0,
                        "",
                        ByteArray{},
                        "",
                        0,
                        0,
                        "",
                        0,
                        BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                            BorderAgent::kExtendedPanIdBit | BorderAgent::kStateBit};

    BorderAgentToJson(ba_orig, json);

    BorderAgentFromJson(new_val, json);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kAddrBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kPortBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kNetworkNameBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0);
    EXPECT_TRUE((new_val.mPresentFlags & BorderAgent::kStateBit) != 0);
    EXPECT_TRUE(new_val.mAddr == ba_orig.mAddr);
    EXPECT_TRUE(new_val.mPort == ba_orig.mPort);
    EXPECT_TRUE(new_val.mNetworkName == ba_orig.mNetworkName);
    EXPECT_TRUE(new_val.mState == ba_orig.mState);
    EXPECT_TRUE(new_val.mExtendedPanId == ba_orig.mExtendedPanId);
}